

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

BrotliDecoderResult
duckdb_brotli::BrotliDecoderDecompress
          (size_t encoded_size,uint8_t *encoded_buffer,size_t *decoded_size,uint8_t *decoded_buffer)

{
  int iVar1;
  BrotliDecoderResult BVar2;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  size_t total_out;
  BrotliDecoderStateInternal s;
  uint8_t *local_16b8;
  size_t local_16b0;
  uint8_t *local_16a8;
  size_t local_16a0;
  size_t local_1698;
  BrotliDecoderStateInternal local_1690;
  
  local_1698 = 0;
  local_16b0 = *decoded_size;
  BVar2 = BROTLI_DECODER_RESULT_ERROR;
  local_16b8 = decoded_buffer;
  local_16a8 = encoded_buffer;
  local_16a0 = encoded_size;
  iVar1 = BrotliDecoderStateInit
                    (&local_1690,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  if (iVar1 != 0) {
    BVar2 = BrotliDecoderDecompressStream
                      (&local_1690,&local_16a0,&local_16a8,&local_16b0,&local_16b8,&local_1698);
    *decoded_size = local_1698;
    BrotliDecoderStateCleanup(&local_1690);
    BVar2 = (BrotliDecoderResult)(BVar2 == BROTLI_DECODER_RESULT_SUCCESS);
  }
  return BVar2;
}

Assistant:

BrotliDecoderResult BrotliDecoderDecompress(size_t encoded_size,
                                            const uint8_t encoded_buffer[BROTLI_ARRAY_PARAM(encoded_size)],
                                            size_t *decoded_size,
                                            uint8_t decoded_buffer[BROTLI_ARRAY_PARAM(*decoded_size)]) {
	BrotliDecoderState s;
	BrotliDecoderResult result;
	size_t total_out = 0;
	size_t available_in = encoded_size;
	const uint8_t *next_in = encoded_buffer;
	size_t available_out = *decoded_size;
	uint8_t *next_out = decoded_buffer;
	if (!BrotliDecoderStateInit(&s, 0, 0, 0)) {
		return BROTLI_DECODER_RESULT_ERROR;
	}
	result = BrotliDecoderDecompressStream(&s, &available_in, &next_in, &available_out, &next_out, &total_out);
	*decoded_size = total_out;
	BrotliDecoderStateCleanup(&s);
	if (result != BROTLI_DECODER_RESULT_SUCCESS) {
		result = BROTLI_DECODER_RESULT_ERROR;
	}
	return result;
}